

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxBoxDetector.cpp
# Opt level: O2

void __thiscall
cbtBoxBoxDetector::getClosestPoints
          (cbtBoxBoxDetector *this,ClosestPointInput *input,Result *output,cbtIDebugDraw *param_3,
          bool param_4)

{
  uint uVar1;
  float fVar2;
  long lVar3;
  undefined8 uVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  cbtVector3 cVar7;
  int return_code;
  cbtScalar depth;
  dMatrix3 R2;
  dMatrix3 R1;
  cbtVector3 normal;
  dContactGeom *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int local_c0;
  cbtScalar local_bc;
  cbtScalar local_b8 [2];
  uint auStack_b0 [10];
  cbtScalar local_88 [2];
  undefined4 auStack_80 [10];
  cbtVector3 local_58;
  cbtVector3 local_48;
  cbtVector3 local_38;
  
  for (lVar3 = 0; uVar6 = in_ZMM0._8_8_, lVar3 != 0x30; lVar3 = lVar3 + 0x10) {
    *(undefined8 *)((long)auStack_80 + lVar3 + -8) =
         *(undefined8 *)((long)(input->m_transformA).m_basis.m_el[0].m_floats + lVar3);
    *(undefined8 *)((long)auStack_b0 + lVar3 + -8) =
         *(undefined8 *)((long)(input->m_transformB).m_basis.m_el[0].m_floats + lVar3);
    *(undefined4 *)((long)auStack_80 + lVar3) =
         *(undefined4 *)((long)(input->m_transformA).m_basis.m_el[0].m_floats + lVar3 + 8);
    uVar1 = *(uint *)((long)(input->m_transformB).m_basis.m_el[0].m_floats + lVar3 + 8);
    in_ZMM0 = ZEXT464(uVar1);
    *(uint *)((long)auStack_b0 + lVar3) = uVar1;
  }
  cVar7 = cbtBoxShape::getHalfExtentsWithMargin(this->m_box1);
  auVar4._0_4_ = cVar7.m_floats[0] + cVar7.m_floats[0];
  auVar4._4_4_ = cVar7.m_floats[1] + cVar7.m_floats[1];
  auVar4._8_4_ = (float)uVar6 + (float)uVar6;
  fVar2 = (float)((ulong)uVar6 >> 0x20);
  auVar4._12_4_ = fVar2 + fVar2;
  local_48.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar4,ZEXT416((uint)(cVar7.m_floats[2] + cVar7.m_floats[2])),0x28);
  uVar6 = local_48.m_floats._8_8_;
  cVar7 = cbtBoxShape::getHalfExtentsWithMargin(this->m_box2);
  auVar5._0_4_ = cVar7.m_floats[0] + cVar7.m_floats[0];
  auVar5._4_4_ = cVar7.m_floats[1] + cVar7.m_floats[1];
  auVar5._8_4_ = (float)uVar6 + (float)uVar6;
  fVar2 = (float)((ulong)uVar6 >> 0x20);
  auVar5._12_4_ = fVar2 + fVar2;
  local_58.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar5,ZEXT416((uint)(cVar7.m_floats[2] + cVar7.m_floats[2])),0x28);
  dBoxBox2(&(input->m_transformA).m_origin,local_88,&local_48,&(input->m_transformB).m_origin,
           local_b8,&local_58,&local_38,&local_bc,&local_c0,4,in_stack_ffffffffffffff28,
           in_stack_ffffffffffffff30,output);
  return;
}

Assistant:

void cbtBoxBoxDetector::getClosestPoints(const ClosestPointInput& input, Result& output, class cbtIDebugDraw* /*debugDraw*/, bool /*swapResults*/)
{
	const cbtTransform& transformA = input.m_transformA;
	const cbtTransform& transformB = input.m_transformB;

	int skip = 0;
	dContactGeom* contact = 0;

	dMatrix3 R1;
	dMatrix3 R2;

	for (int j = 0; j < 3; j++)
	{
		R1[0 + 4 * j] = transformA.getBasis()[j].x();
		R2[0 + 4 * j] = transformB.getBasis()[j].x();

		R1[1 + 4 * j] = transformA.getBasis()[j].y();
		R2[1 + 4 * j] = transformB.getBasis()[j].y();

		R1[2 + 4 * j] = transformA.getBasis()[j].z();
		R2[2 + 4 * j] = transformB.getBasis()[j].z();
	}

	cbtVector3 normal;
	cbtScalar depth;
	int return_code;
	int maxc = 4;

	dBoxBox2(transformA.getOrigin(),
			 R1,
			 2.f * m_box1->getHalfExtentsWithMargin(),
			 transformB.getOrigin(),
			 R2,
			 2.f * m_box2->getHalfExtentsWithMargin(),
			 normal, &depth, &return_code,
			 maxc, contact, skip,
			 output);
}